

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O1

void __thiscall OpenMD::NVT::moveB(NVT *this)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  pointer pVVar5;
  pointer pVVar6;
  Snapshot *pSVar7;
  RealType RVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint i_3;
  Molecule *pMVar11;
  undefined1 *puVar12;
  uint i_1;
  long lVar13;
  StuntDouble *pSVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  pointer ppSVar20;
  int iVar21;
  pair<double,_double> pVar22;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result_3;
  pair<double,_double> thermostat;
  MoleculeIterator i;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector3d frc;
  Vector3d Tb;
  Vector3d vel;
  Vector3d ji;
  Vector3d local_168;
  Vector3d local_148;
  pair<double,_double> local_130;
  MoleculeIterator local_120;
  double local_118 [4];
  double local_f8 [3];
  Thermo *local_e0;
  double local_d8;
  ulong local_d0;
  double local_c8 [4];
  double local_a8 [4];
  double local_88;
  double dStack_80;
  double local_78;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  undefined8 uStack_40;
  
  iVar21 = 0;
  local_120._M_node = (_Base_ptr)0x0;
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_58 = 0.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_78 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_c8[2] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  pVar22 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  local_130.second = pVar22.second;
  local_130.first = pVar22.first;
  local_d8 = local_130.first;
  pMVar11 = SimInfo::beginMolecule
                      ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_120);
  if (pMVar11 != (Molecule *)0x0) {
    do {
      ppSVar20 = (pMVar11->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar20 ==
          (pMVar11->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar14 = (StuntDouble *)0x0;
      }
      else {
        pSVar14 = *ppSVar20;
      }
      if (pSVar14 != (StuntDouble *)0x0) {
        pVVar5 = (this->oldVel_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar6 = (this->oldJi_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)iVar21 * 0x18;
        do {
          ppSVar20 = ppSVar20 + 1;
          pSVar7 = pSVar14->snapshotMan_->currentSnapshot_;
          lVar16 = (long)pSVar14->localIndex_;
          lVar19 = *(long *)((long)&(pSVar7->atomData).velocity.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_);
          puVar1 = (undefined8 *)(lVar19 + lVar16 * 0x18);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          *(undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
               *(undefined8 *)(lVar19 + 0x10 + lVar16 * 0x18);
          puVar1 = (undefined8 *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar15);
          *puVar1 = uVar9;
          puVar1[1] = uVar10;
          if (pSVar14->objType_ - otDAtom < 2) {
            lVar19 = *(long *)((long)&(pSVar7->atomData).angularMomentum.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + pSVar14->storage_)
            ;
            puVar1 = (undefined8 *)(lVar19 + lVar16 * 0x18);
            uVar9 = *puVar1;
            uVar10 = puVar1[1];
            *(undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15 + 0x10) =
                 *(undefined8 *)(lVar19 + 0x10 + lVar16 * 0x18);
            puVar1 = (undefined8 *)((long)(pVVar6->super_Vector<double,_3U>).data_ + lVar15);
            *puVar1 = uVar9;
            puVar1[1] = uVar10;
          }
          if (ppSVar20 ==
              (pMVar11->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar14 = (StuntDouble *)0x0;
          }
          else {
            pSVar14 = *ppSVar20;
          }
          lVar15 = lVar15 + 0x18;
          iVar21 = iVar21 + 1;
        } while (pSVar14 != (StuntDouble *)0x0);
      }
      pMVar11 = SimInfo::nextMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_120)
      ;
    } while (pMVar11 != (Molecule *)0x0);
  }
  if (0 < this->maxIterNum_) {
    local_e0 = &(this->super_VelocityVerletIntegrator).super_Integrator.thermo;
    uVar18 = 0;
    do {
      RVar8 = Thermo::getTemperature(local_e0);
      local_48 = local_130.first;
      uStack_40 = 0;
      local_130.first =
           ((RVar8 / this->targetTemp_ + -1.0) *
           (this->super_VelocityVerletIntegrator).super_Integrator.dt2) /
           (this->tauThermostat_ * this->tauThermostat_) + local_d8;
      pMVar11 = SimInfo::beginMolecule
                          ((this->super_VelocityVerletIntegrator).super_Integrator.info_,&local_120)
      ;
      if (pMVar11 != (Molecule *)0x0) {
        lVar15 = 0;
        local_d0 = uVar18;
        do {
          ppSVar20 = (pMVar11->integrableObjects_).
                     super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppSVar20 ==
              (pMVar11->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            pSVar14 = (StuntDouble *)0x0;
          }
          else {
            pSVar14 = *ppSVar20;
          }
          if (pSVar14 != (StuntDouble *)0x0) {
            lVar15 = (long)(int)lVar15;
            lVar19 = lVar15 * 0x18;
            do {
              lVar16 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).force.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar14->storage_);
              local_c8[2] = (double)*(undefined8 *)
                                     (lVar16 + 0x10 + (long)pSVar14->localIndex_ * 0x18);
              pdVar2 = (double *)(lVar16 + (long)pSVar14->localIndex_ * 0x18);
              local_c8[0] = *pdVar2;
              local_c8[1] = pdVar2[1];
              pVVar5 = (this->oldVel_).
                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
              dVar4 = pSVar14->mass_;
              local_f8[0] = 0.0;
              local_f8[1] = 0.0;
              local_f8[2] = 0.0;
              lVar16 = 0;
              do {
                local_f8[lVar16] = local_c8[lVar16] * (dVar3 / dVar4) * 0.0004184;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_168.super_Vector<double,_3U>.data_[0] = 0.0;
              local_168.super_Vector<double,_3U>.data_[1] = 0.0;
              local_168.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar16 = 0;
              do {
                local_168.super_Vector<double,_3U>.data_[lVar16] =
                     *(double *)
                      ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar16 * 8 + lVar19) +
                     local_f8[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_118[0] = 0.0;
              local_118[1] = 0.0;
              local_118[2] = 0.0;
              lVar16 = 0;
              do {
                local_118[lVar16] =
                     *(double *)
                      ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar16 * 8 + lVar19) *
                     dVar3 * local_130.first;
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_148.super_Vector<double,_3U>.data_[0] = 0.0;
              local_148.super_Vector<double,_3U>.data_[1] = 0.0;
              local_148.super_Vector<double,_3U>.data_[2] = 0.0;
              lVar16 = 0;
              do {
                local_148.super_Vector<double,_3U>.data_[lVar16] =
                     local_168.super_Vector<double,_3U>.data_[lVar16] - local_118[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              local_78 = local_148.super_Vector<double,_3U>.data_[2];
              local_88 = local_148.super_Vector<double,_3U>.data_[0];
              dStack_80 = local_148.super_Vector<double,_3U>.data_[1];
              pSVar7 = pSVar14->snapshotMan_->currentSnapshot_;
              lVar13 = (long)pSVar14->localIndex_;
              lVar16 = *(long *)((long)&(pSVar7->atomData).velocity.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                pSVar14->storage_);
              *(double *)(lVar16 + 0x10 + lVar13 * 0x18) =
                   local_148.super_Vector<double,_3U>.data_[2];
              pdVar2 = (double *)(lVar16 + lVar13 * 0x18);
              *pdVar2 = local_148.super_Vector<double,_3U>.data_[0];
              pdVar2[1] = local_148.super_Vector<double,_3U>.data_[1];
              if (pSVar14->objType_ - otDAtom < 2) {
                puVar12 = (undefined1 *)
                          (lVar13 * 0x18 +
                          *(long *)((long)&(pSVar7->atomData).torque.
                                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                   pSVar14->storage_));
                local_168.super_Vector<double,_3U>.data_[0] = 0.0;
                local_168.super_Vector<double,_3U>.data_[1] = 0.0;
                local_168.super_Vector<double,_3U>.data_[2] = 0.0;
                if ((Vector3d *)puVar12 != &local_168) {
                  lVar16 = 0;
                  do {
                    local_168.super_Vector<double,_3U>.data_[lVar16] =
                         *(double *)(puVar12 + lVar16 * 8);
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 3);
                }
                StuntDouble::lab2Body(&local_148,pSVar14,&local_168);
                local_a8[2] = local_148.super_Vector<double,_3U>.data_[2];
                local_a8[0] = local_148.super_Vector<double,_3U>.data_[0];
                local_a8[1] = local_148.super_Vector<double,_3U>.data_[1];
                pVVar5 = (this->oldJi_).
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar3 = (this->super_VelocityVerletIntegrator).super_Integrator.dt2;
                local_f8[0] = 0.0;
                local_f8[1] = 0.0;
                local_f8[2] = 0.0;
                lVar16 = 0;
                do {
                  local_f8[lVar16] = local_a8[lVar16] * dVar3 * 0.0004184;
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 3);
                local_168.super_Vector<double,_3U>.data_[0] = 0.0;
                local_168.super_Vector<double,_3U>.data_[1] = 0.0;
                local_168.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar16 = 0;
                do {
                  local_168.super_Vector<double,_3U>.data_[lVar16] =
                       *(double *)
                        ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar16 * 8 + lVar19) +
                       local_f8[lVar16];
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 3);
                local_118[0] = 0.0;
                local_118[1] = 0.0;
                local_118[2] = 0.0;
                lVar16 = 0;
                do {
                  local_118[lVar16] =
                       *(double *)
                        ((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar16 * 8 + lVar19) *
                       dVar3 * local_130.first;
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 3);
                local_148.super_Vector<double,_3U>.data_[0] = 0.0;
                local_148.super_Vector<double,_3U>.data_[1] = 0.0;
                local_148.super_Vector<double,_3U>.data_[2] = 0.0;
                lVar16 = 0;
                do {
                  local_148.super_Vector<double,_3U>.data_[lVar16] =
                       local_168.super_Vector<double,_3U>.data_[lVar16] - local_118[lVar16];
                  lVar16 = lVar16 + 1;
                } while (lVar16 != 3);
                local_58 = local_148.super_Vector<double,_3U>.data_[2];
                local_68 = local_148.super_Vector<double,_3U>.data_[0];
                dStack_60 = local_148.super_Vector<double,_3U>.data_[1];
                iVar21 = pSVar14->localIndex_;
                lVar16 = *(long *)((long)&(pSVar14->snapshotMan_->currentSnapshot_->atomData).
                                          angularMomentum.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  pSVar14->storage_);
                *(double *)(lVar16 + 0x10 + (long)iVar21 * 0x18) =
                     local_148.super_Vector<double,_3U>.data_[2];
                pdVar2 = (double *)(lVar16 + (long)iVar21 * 0x18);
                *pdVar2 = local_148.super_Vector<double,_3U>.data_[0];
                pdVar2[1] = local_148.super_Vector<double,_3U>.data_[1];
              }
              ppSVar20 = ppSVar20 + 1;
              if (ppSVar20 ==
                  (pMVar11->integrableObjects_).
                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pSVar14 = (StuntDouble *)0x0;
              }
              else {
                pSVar14 = *ppSVar20;
              }
              lVar15 = lVar15 + 1;
              lVar19 = lVar19 + 0x18;
              uVar18 = local_d0;
            } while (pSVar14 != (StuntDouble *)0x0);
          }
          pMVar11 = SimInfo::nextMolecule
                              ((this->super_VelocityVerletIntegrator).super_Integrator.info_,
                               &local_120);
        } while (pMVar11 != (Molecule *)0x0);
      }
      Rattle::constraintB((this->super_VelocityVerletIntegrator).super_Integrator.rattle_);
    } while ((this->chiTolerance_ < ABS(local_48 - local_130.first)) &&
            (uVar17 = (int)uVar18 + 1, uVar18 = (ulong)uVar17, (int)uVar17 < this->maxIterNum_));
  }
  (*((this->super_VelocityVerletIntegrator).super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  local_130.second =
       (this->super_VelocityVerletIntegrator).super_Integrator.dt2 * local_130.first +
       local_130.second;
  Snapshot::setThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap,&local_130);
  return;
}

Assistant:

void NVT::moveB() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;

    Vector3d Tb;
    Vector3d ji;
    Vector3d vel;
    Vector3d frc;
    RealType mass;
    RealType instTemp;
    int index;
    // Set things up for the iteration:

    pair<RealType, RealType> thermostat = snap->getThermostat();
    RealType oldChi                     = thermostat.first;
    RealType prevChi;

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel_[index] = sd->getVel();

        if (sd->isDirectional()) oldJi_[index] = sd->getJ();

        ++index;
      }
    }

    // do the iteration:

    for (int k = 0; k < maxIterNum_; k++) {
      index    = 0;
      instTemp = thermo.getTemperature();

      // evolve chi another half step using the temperature at t + dt/2

      prevChi          = thermostat.first;
      thermostat.first = oldChi + dt2 * (instTemp / targetTemp_ - 1.0) /
                                      (tauThermostat_ * tauThermostat_);

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          // velocity half step

          vel = oldVel_[index] + dt2 / mass * Constants::energyConvert * frc -
                dt2 * thermostat.first * oldVel_[index];

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame

            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi_[index] + dt2 * Constants::energyConvert * Tb -
                 dt2 * thermostat.first * oldJi_[index];

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if (fabs(prevChi - thermostat.first) <= chiTolerance_) break;
    }

    flucQ_->moveB();

    thermostat.second += dt2 * thermostat.first;
    snap->setThermostat(thermostat);
  }